

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionBody.cpp
# Opt level: O2

ushort __thiscall Js::SmallSpanSequence::GetDiff(SmallSpanSequence *this,int current,int prev)

{
  int iVar1;
  GrowingUint32HeapArray *this_00;
  
  iVar1 = current - prev;
  if (iVar1 - 0x7fffU < 0xffff0001) {
    this_00 = this->pActualOffsetList;
    if (this_00 == (GrowingUint32HeapArray *)0x0) {
      this_00 = JsUtil::GrowingArray<unsigned_int,_Memory::HeapAllocator>::Create(4);
      this->pActualOffsetList = this_00;
    }
    JsUtil::GrowingArray<unsigned_int,_Memory::HeapAllocator>::Add(this_00,current);
    iVar1 = 0x7fff;
  }
  return (ushort)iVar1;
}

Assistant:

ushort SmallSpanSequence::GetDiff(int current, int prev)
    {
        int diff = current - prev;

        if ((diff) < SHRT_MIN  || (diff) >= SHRT_MAX)
        {
            diff = SHRT_MAX;

            if (!this->pActualOffsetList)
            {
                this->pActualOffsetList = JsUtil::GrowingUint32HeapArray::Create(4);
            }

            this->pActualOffsetList->Add(current);
        }

        return (ushort)diff;
    }